

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O1

void __thiscall tcu::FileResource::~FileResource(FileResource *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Resource)._vptr_Resource = (_func_int **)&PTR__FileResource_00277388;
  fclose((FILE *)this->m_file);
  (this->super_Resource)._vptr_Resource = (_func_int **)&PTR__Resource_00277458;
  pcVar1 = (this->super_Resource).m_name._M_dataplus._M_p;
  paVar2 = &(this->super_Resource).m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

FileResource::~FileResource ()
{
	fclose(m_file);
}